

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O0

unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
__thiscall sf2cute::SoundFontWriter::MakeInfoListChunk(SoundFontWriter *this)

{
  bool bVar1;
  pointer pRVar2;
  SoundFont *pSVar3;
  string *psVar4;
  SoundFontWriter *in_RSI;
  string local_360;
  allocator<char> local_339;
  string local_338;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_318;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_2c8;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_278;
  string local_270;
  allocator<char> local_249;
  string local_248;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_228;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_1d8;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_188;
  SFVersionTag local_17e;
  allocator<char> local_179;
  string local_178;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_158;
  string local_150;
  allocator<char> local_129;
  string local_128;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_108;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_b8;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_68;
  SFVersionTag local_60 [5];
  allocator<char> local_49;
  string local_48;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_28;
  unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_> local_20;
  unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_> info;
  SoundFontWriter *this_local;
  
  std::make_unique<sf2cute::RIFFListChunk,char_const(&)[5]>((char (*) [5])&local_20);
  pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
           operator->(&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ifil",&local_49);
  SFVersionTag::SFVersionTag(local_60,2,1);
  MakeVersionChunk((SoundFontWriter *)&local_28,&local_48,local_60[0]);
  RIFFListChunk::AddSubchunk(pRVar2,&local_28);
  std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>::
  ~unique_ptr(&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
           operator->(&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"isng",&local_89);
  pSVar3 = file(in_RSI);
  psVar4 = SoundFont::sound_engine_abi_cxx11_(pSVar3);
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar4);
  MakeZSTRChunk((SoundFontWriter *)&local_68,&local_88,&local_b0);
  RIFFListChunk::AddSubchunk(pRVar2,&local_68);
  std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>::
  ~unique_ptr(&local_68);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
           operator->(&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"INAM",&local_d9);
  pSVar3 = file(in_RSI);
  psVar4 = SoundFont::bank_name_abi_cxx11_(pSVar3);
  std::__cxx11::string::substr((ulong)&local_100,(ulong)psVar4);
  MakeZSTRChunk((SoundFontWriter *)&local_b8,&local_d8,&local_100);
  RIFFListChunk::AddSubchunk(pRVar2,&local_b8);
  std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>::
  ~unique_ptr(&local_b8);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pSVar3 = file(in_RSI);
  bVar1 = SoundFont::has_rom_name(pSVar3);
  if (bVar1) {
    pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
             operator->(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"irom",&local_129);
    pSVar3 = file(in_RSI);
    psVar4 = SoundFont::rom_name_abi_cxx11_(pSVar3);
    std::__cxx11::string::substr((ulong)&local_150,(ulong)psVar4);
    MakeZSTRChunk((SoundFontWriter *)&local_108,&local_128,&local_150);
    RIFFListChunk::AddSubchunk(pRVar2,&local_108);
    std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
    ::~unique_ptr(&local_108);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  pSVar3 = file(in_RSI);
  bVar1 = SoundFont::has_rom_version(pSVar3);
  if (bVar1) {
    pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
             operator->(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"iver",&local_179);
    pSVar3 = file(in_RSI);
    local_17e = SoundFont::rom_version(pSVar3);
    MakeVersionChunk((SoundFontWriter *)&local_158,&local_178,local_17e);
    RIFFListChunk::AddSubchunk(pRVar2,&local_158);
    std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
    ::~unique_ptr(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  pSVar3 = file(in_RSI);
  bVar1 = SoundFont::has_creation_date(pSVar3);
  if (bVar1) {
    pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
             operator->(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"ICRD",&local_1a9);
    pSVar3 = file(in_RSI);
    psVar4 = SoundFont::creation_date_abi_cxx11_(pSVar3);
    std::__cxx11::string::substr((ulong)&local_1d0,(ulong)psVar4);
    MakeZSTRChunk((SoundFontWriter *)&local_188,&local_1a8,&local_1d0);
    RIFFListChunk::AddSubchunk(pRVar2,&local_188);
    std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
    ::~unique_ptr(&local_188);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
  }
  pSVar3 = file(in_RSI);
  bVar1 = SoundFont::has_engineers(pSVar3);
  if (bVar1) {
    pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
             operator->(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"IENG",&local_1f9);
    pSVar3 = file(in_RSI);
    psVar4 = SoundFont::engineers_abi_cxx11_(pSVar3);
    std::__cxx11::string::substr((ulong)&local_220,(ulong)psVar4);
    MakeZSTRChunk((SoundFontWriter *)&local_1d8,&local_1f8,&local_220);
    RIFFListChunk::AddSubchunk(pRVar2,&local_1d8);
    std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
    ::~unique_ptr(&local_1d8);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
  }
  pSVar3 = file(in_RSI);
  bVar1 = SoundFont::has_product(pSVar3);
  if (bVar1) {
    pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
             operator->(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"IPRD",&local_249);
    pSVar3 = file(in_RSI);
    psVar4 = SoundFont::product_abi_cxx11_(pSVar3);
    std::__cxx11::string::substr((ulong)&local_270,(ulong)psVar4);
    MakeZSTRChunk((SoundFontWriter *)&local_228,&local_248,&local_270);
    RIFFListChunk::AddSubchunk(pRVar2,&local_228);
    std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
    ::~unique_ptr(&local_228);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
  }
  pSVar3 = file(in_RSI);
  bVar1 = SoundFont::has_copyright(pSVar3);
  if (bVar1) {
    pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
             operator->(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"ICOP",&local_299);
    pSVar3 = file(in_RSI);
    psVar4 = SoundFont::copyright_abi_cxx11_(pSVar3);
    std::__cxx11::string::substr((ulong)&local_2c0,(ulong)psVar4);
    MakeZSTRChunk((SoundFontWriter *)&local_278,&local_298,&local_2c0);
    RIFFListChunk::AddSubchunk(pRVar2,&local_278);
    std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
    ::~unique_ptr(&local_278);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
  }
  pSVar3 = file(in_RSI);
  bVar1 = SoundFont::has_comment(pSVar3);
  if (bVar1) {
    pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
             operator->(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"ICMT",&local_2e9);
    pSVar3 = file(in_RSI);
    psVar4 = SoundFont::comment_abi_cxx11_(pSVar3);
    std::__cxx11::string::substr((ulong)&local_310,(ulong)psVar4);
    MakeZSTRChunk((SoundFontWriter *)&local_2c8,&local_2e8,&local_310);
    RIFFListChunk::AddSubchunk(pRVar2,&local_2c8);
    std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
    ::~unique_ptr(&local_2c8);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
  }
  pSVar3 = file(in_RSI);
  bVar1 = SoundFont::has_software(pSVar3);
  if (bVar1) {
    pRVar2 = std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::
             operator->(&local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"ISFT",&local_339);
    pSVar3 = file(in_RSI);
    psVar4 = SoundFont::software_abi_cxx11_(pSVar3);
    std::__cxx11::string::substr((ulong)&local_360,(ulong)psVar4);
    MakeZSTRChunk((SoundFontWriter *)&local_318,&local_338,&local_360);
    RIFFListChunk::AddSubchunk(pRVar2,&local_318);
    std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
    ::~unique_ptr(&local_318);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
  }
  std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>::
  unique_ptr<sf2cute::RIFFListChunk,std::default_delete<sf2cute::RIFFListChunk>,void>
            ((unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>
              *)this,&local_20);
  std::unique_ptr<sf2cute::RIFFListChunk,_std::default_delete<sf2cute::RIFFListChunk>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
          )(__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<RIFFChunkInterface> SoundFontWriter::MakeInfoListChunk() {
  std::unique_ptr<RIFFListChunk> info = std::make_unique<RIFFListChunk>("INFO");

  // Mandatory chunks:

  info->AddSubchunk(MakeVersionChunk("ifil", SFVersionTag(2, 1)));

  info->AddSubchunk(MakeZSTRChunk("isng", file().sound_engine().substr(0, SoundFont::kInfoTextMaxLength)));

  info->AddSubchunk(MakeZSTRChunk("INAM", file().bank_name().substr(0, SoundFont::kInfoTextMaxLength)));

  // Optional chunks:

  if (file().has_rom_name()) {
    info->AddSubchunk(MakeZSTRChunk("irom", file().rom_name().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_rom_version()) {
    info->AddSubchunk(MakeVersionChunk("iver", file().rom_version()));
  }

  if (file().has_creation_date()) {
    info->AddSubchunk(MakeZSTRChunk("ICRD", file().creation_date().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_engineers()) {
    info->AddSubchunk(MakeZSTRChunk("IENG", file().engineers().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_product()) {
    info->AddSubchunk(MakeZSTRChunk("IPRD", file().product().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_copyright()) {
    info->AddSubchunk(MakeZSTRChunk("ICOP", file().copyright().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_comment()) {
    info->AddSubchunk(MakeZSTRChunk("ICMT", file().comment().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  if (file().has_software()) {
    info->AddSubchunk(MakeZSTRChunk("ISFT", file().software().substr(0, SoundFont::kInfoTextMaxLength)));
  }

  return std::move(info);
}